

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O0

bool __thiscall
iDynTree::InverseKinematics::addFrameConstraint(InverseKinematics *this,string *frameName)

{
  bool bVar1;
  
  bVar1 = missingIpoptErrorReport();
  return bVar1;
}

Assistant:

bool InverseKinematics::addFrameConstraint(const std::string& frameName)
    {
#ifdef IDYNTREE_USES_IPOPT
        assert(m_pimpl);
        iDynTree::Transform w_X_frame = IK_PIMPL(m_pimpl)->dynamics().getWorldTransform(frameName);
        return addFrameConstraint(frameName, w_X_frame);
#else
        return missingIpoptErrorReport();
#endif
    }